

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Builder * __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::getSchema
          (Builder *__return_storage_ptr__,MemberInfo *this)

{
  uint uVar1;
  Reader *pRVar2;
  Reader *dc;
  Reader *_dc1125;
  undefined1 local_70 [8];
  FieldSourceInfoBuilderPair builderPair;
  Builder *result;
  Builder *_result1113;
  MemberInfo *this_local;
  
  builderPair.sourceInfo._builder._32_8_ =
       kj::_::readMaybe<capnp::schema::Field::Builder>(&this->schema);
  if ((Builder *)builderPair.sourceInfo._builder._32_8_ == (Builder *)0x0) {
    this->index = this->parent->childInitializedCount;
    addMemberSchema((FieldSourceInfoBuilderPair *)local_70,this->parent);
    memcpy(__return_storage_ptr__,local_70,0x28);
    if ((this->isInUnion & 1U) != 0) {
      uVar1 = this->parent->unionDiscriminantCount;
      this->parent->unionDiscriminantCount = uVar1 + 1;
      capnp::schema::Field::Builder::setDiscriminantValue(__return_storage_ptr__,(uint16_t)uVar1);
    }
    Text::Reader::Reader((Reader *)&_dc1125,&this->name);
    capnp::schema::Field::Builder::setName(__return_storage_ptr__,(Reader)__dc1125);
    capnp::schema::Field::Builder::setCodeOrder(__return_storage_ptr__,(uint16_t)this->codeOrder);
    pRVar2 = kj::_::readMaybe<capnp::Text::Reader>(&this->docComment);
    if (pRVar2 != (Reader *)0x0) {
      capnp::schema::Node::SourceInfo::Member::Builder::setDocComment
                ((Builder *)&builderPair.field._builder.dataSize,
                 (Reader)(pRVar2->super_StringPtr).content);
    }
    capnp::schema::Node::SourceInfo::Member::Builder::setStartByte
              ((Builder *)&builderPair.field._builder.dataSize,this->startByte);
    capnp::schema::Node::SourceInfo::Member::Builder::setEndByte
              ((Builder *)&builderPair.field._builder.dataSize,this->endByte);
    kj::Maybe<capnp::schema::Field::Builder>::operator=(&this->schema,__return_storage_ptr__);
  }
  else {
    memcpy(__return_storage_ptr__,(void *)builderPair.sourceInfo._builder._32_8_,0x28);
  }
  return __return_storage_ptr__;
}

Assistant:

schema::Field::Builder getSchema() {
      KJ_IF_SOME(result, schema) {
        return result;
      } else {
        index = parent->childInitializedCount;
        auto builderPair = parent->addMemberSchema();
        auto builder = builderPair.field;
        if (isInUnion) {
          builder.setDiscriminantValue(parent->unionDiscriminantCount++);
        }
        builder.setName(name);
        builder.setCodeOrder(codeOrder);

        KJ_IF_SOME(dc, docComment) {
          builderPair.sourceInfo.setDocComment(dc);
        }
        builderPair.sourceInfo.setStartByte(startByte);
        builderPair.sourceInfo.setEndByte(endByte);

        schema = builder;
        return builder;
      }